

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O1

void __thiscall xray_re::se_actor::state_write(se_actor *this,xr_packet *packet)

{
  ushort uVar1;
  long *local_40 [2];
  long local_30 [2];
  
  cse_alife_creature_actor::state_write(&this->super_cse_alife_creature_actor,packet);
  uVar1 = *(ushort *)
           &(this->super_cse_alife_creature_actor).super_cse_alife_creature_abstract.field_0x28;
  if (uVar1 < 0x80) {
    if (uVar1 < 0x7a) {
      if ((ushort)(uVar1 - 0x65) < 0x12) {
        return;
      }
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0xf7,"virtual void xray_re::se_actor::state_write(xr_packet &)");
    }
    if (0x7c < uVar1) {
      __assert_fail("m_version <= CSE_VERSION_CS",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0xb1,"virtual void xray_re::se_actor::state_write(xr_packet &)");
    }
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_SAVE,false,"se_actor");
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_SAVE,false,"CRandomTask");
    (*packet->_vptr_xr_packet[8])(packet,0);
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_SAVE,false,"object_collection");
    (*packet->_vptr_xr_packet[8])(packet,0);
    (*packet->_vptr_xr_packet[8])(packet,0);
    (*packet->_vptr_xr_packet[8])(packet,0);
    (*packet->_vptr_xr_packet[8])(packet,0);
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_SAVE,true,"object_collection");
    (*packet->_vptr_xr_packet[10])(packet,0);
    (*packet->_vptr_xr_packet[8])(packet,0);
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_SAVE,true,"CRandomTask");
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_SAVE,false,"object_collection");
    (*packet->_vptr_xr_packet[8])(packet,0);
    (*packet->_vptr_xr_packet[8])(packet,0);
    (*packet->_vptr_xr_packet[8])(packet,0);
    (*packet->_vptr_xr_packet[8])(packet,0);
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_SAVE,true,"object_collection");
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_SAVE,false,"CMinigames");
    (*packet->_vptr_xr_packet[8])(packet,2);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"test_crowkiller","");
    (*packet->_vptr_xr_packet[4])(packet,local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"CMGCrowKiller","");
    (*packet->_vptr_xr_packet[4])(packet,local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"valiable","");
    (*packet->_vptr_xr_packet[4])(packet,local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_SAVE,false,"CMGCrowKiller");
    (*packet->_vptr_xr_packet[10])(packet,0);
    (*packet->_vptr_xr_packet[8])(packet,0x3c);
    (*packet->_vptr_xr_packet[0xc])(packet,0);
    (*packet->_vptr_xr_packet[10])(packet,4);
    (*packet->_vptr_xr_packet[6])(packet,0);
    (*packet->_vptr_xr_packet[8])(packet,10);
    (*packet->_vptr_xr_packet[8])(packet,100);
    (*packet->_vptr_xr_packet[10])(packet,0);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"");
    (*packet->_vptr_xr_packet[4])(packet,local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    (*packet->_vptr_xr_packet[10])(packet,0);
    (*packet->_vptr_xr_packet[8])(packet,0);
    (*packet->_vptr_xr_packet[8])(packet,10);
    (*packet->_vptr_xr_packet[10])(packet,0);
    (*packet->_vptr_xr_packet[0xc])(packet,0);
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_SAVE,true,"CMGCrowKiller");
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"test_shooting","");
    (*packet->_vptr_xr_packet[4])(packet,local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"CMGShooting","");
    (*packet->_vptr_xr_packet[4])(packet,local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"valiable","");
    (*packet->_vptr_xr_packet[4])(packet,local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_SAVE,false,"CMGShooting");
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"");
    (*packet->_vptr_xr_packet[4])(packet,local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"");
    (*packet->_vptr_xr_packet[4])(packet,local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"nil","");
    (*packet->_vptr_xr_packet[4])(packet,local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"nil","");
    (*packet->_vptr_xr_packet[4])(packet,local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"nil","");
    (*packet->_vptr_xr_packet[4])(packet,local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"nil","");
    (*packet->_vptr_xr_packet[4])(packet,local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"nil","");
    (*packet->_vptr_xr_packet[4])(packet,local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    (*packet->_vptr_xr_packet[10])(packet,1);
    (*packet->_vptr_xr_packet[8])(packet,0);
    (*packet->_vptr_xr_packet[10])(packet,0);
    (*packet->_vptr_xr_packet[10])(packet,0);
    (*packet->_vptr_xr_packet[10])(packet,0);
    (*packet->_vptr_xr_packet[10])(packet,0);
    (*packet->_vptr_xr_packet[10])(packet,0);
    (*packet->_vptr_xr_packet[6])(packet,0);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"nil","");
    (*packet->_vptr_xr_packet[4])(packet,local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_SAVE,true,"CMGShooting");
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_SAVE,true,"CMinigames");
  }
  else {
    if (uVar1 != 0x80) {
      __assert_fail("m_version <= CSE_VERSION_COP",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0xaa,"virtual void xray_re::se_actor::state_write(xr_packet &)");
    }
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_SAVE,false,"se_actor");
    (*packet->_vptr_xr_packet[0xc])(packet,0);
  }
  cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_SAVE,true,"se_actor");
  return;
}

Assistant:

void se_actor::state_write(xr_packet& packet)
{
	cse_alife_creature_actor::state_write(packet);
	if (m_version >= CSE_VERSION_0x80) {
		xr_assert(m_version <= CSE_VERSION_COP);
		
		set_save_marker(packet, SM_SAVE, false, "se_actor");
		packet.w_bool(0);		//start_position_filled
		set_save_marker(packet, SM_SAVE, true, "se_actor");

	} else if (m_version >= CSE_VERSION_0x7a) {
		xr_assert(m_version <= CSE_VERSION_CS);

		set_save_marker(packet, SM_SAVE, false, "se_actor");

		// CRandomTask
		set_save_marker(packet, SM_SAVE, false, "CRandomTask");
		packet.w_u16(0);
		// CRandomTask's id_generator
		set_save_marker(packet, SM_SAVE, false, "object_collection");
		w_object_collection(packet);
		set_save_marker(packet, SM_SAVE, true, "object_collection");
		packet.w_u8(0);
		packet.w_u16(0);
		set_save_marker(packet, SM_SAVE, true, "CRandomTask");

		// sim_board's id_generator
		set_save_marker(packet, SM_SAVE, false, "object_collection");
		w_object_collection(packet);
		set_save_marker(packet, SM_SAVE, true, "object_collection");

		// CMinigames
		set_save_marker(packet, SM_SAVE, false, "CMinigames");
		packet.w_u16(2);
		packet.w_sz("test_crowkiller");
		packet.w_sz("CMGCrowKiller");
		packet.w_sz("valiable");
		set_save_marker(packet, SM_SAVE, false, "CMGCrowKiller");
		packet.w_u8(0);
		packet.w_u16(60);
		packet.w_bool(false);
		packet.w_u8(4);
		packet.w_u32(0);
		packet.w_u16(10);
		packet.w_u16(100);
		packet.w_u8(0);
		packet.w_sz("");
		packet.w_u8(0);
		packet.w_u16(0);
		packet.w_u16(10);
		packet.w_u8(0);
		packet.w_bool(false);
		set_save_marker(packet, SM_SAVE, true, "CMGCrowKiller");

		packet.w_sz("test_shooting");
		packet.w_sz("CMGShooting");
		packet.w_sz("valiable");
		set_save_marker(packet, SM_SAVE, false, "CMGShooting");
		packet.w_sz("");
		packet.w_sz("");
		packet.w_sz("nil");
		packet.w_sz("nil");
		packet.w_sz("nil");
		packet.w_sz("nil");
		packet.w_sz("nil");
		packet.w_u8(1);
		packet.w_u16(0);
		packet.w_u8(0);
		packet.w_u8(0);
		packet.w_u8(0);
		packet.w_u8(0);
		packet.w_u8(0);
		packet.w_u32(0);
		packet.w_sz("nil");
		set_save_marker(packet, SM_SAVE, true, "CMGShooting");
		set_save_marker(packet, SM_SAVE, true, "CMinigames");

		set_save_marker(packet, SM_SAVE, true, "se_actor");
	} else if (m_version >= CSE_VERSION_2215 && m_version <= CSE_VERSION_SOC) {
		// stub
	} else {
		xr_not_implemented();
	}
}